

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsTTDCreateReplayRuntime
          (JsRuntimeAttributes attributes,char *infoUri,size_t infoUriCount,bool enableDebugging,
          TTDOpenResourceStreamCallback openResourceStream,
          JsTTDReadBytesFromStreamCallback readBytesFromStream,
          JsTTDFlushAndCloseStreamCallback flushAndCloseStream,JsThreadServiceCallback threadService
          ,JsRuntimeHandle *runtime)

{
  JsErrorCode JVar1;
  
  JVar1 = CreateRuntimeCore(attributes,infoUri,infoUriCount,false,true,enableDebugging,0xffffffff,
                            0xffffffff,openResourceStream,readBytesFromStream,
                            (JsTTDWriteBytesToStreamCallback)0x0,flushAndCloseStream,threadService,
                            runtime);
  return JVar1;
}

Assistant:

CHAKRA_API JsTTDCreateReplayRuntime(_In_ JsRuntimeAttributes attributes, _In_reads_(infoUriCount) const char* infoUri, _In_ size_t infoUriCount, _In_ bool enableDebugging,
    _In_ TTDOpenResourceStreamCallback openResourceStream, _In_ JsTTDReadBytesFromStreamCallback readBytesFromStream, _In_ JsTTDFlushAndCloseStreamCallback flushAndCloseStream,
    _In_opt_ JsThreadServiceCallback threadService, _Out_ JsRuntimeHandle *runtime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else

    return CreateRuntimeCore(attributes, infoUri, infoUriCount, false, true, enableDebugging, UINT_MAX, UINT_MAX,
        openResourceStream, readBytesFromStream, nullptr, flushAndCloseStream,
        threadService, runtime);
#endif
}